

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# posix_resolv_gai.c
# Opt level: O1

int parse_ip(char *addr,nng_sockaddr *sa,_Bool want_port)

{
  bool bVar1;
  bool bVar2;
  undefined4 uVar3;
  int iVar4;
  char *pcVar5;
  char *__service;
  char cVar6;
  char *pcVar7;
  char local_98 [8];
  char buf [64];
  addrinfo hints;
  addrinfo *results;
  
  pcVar7 = local_98;
  snprintf(pcVar7,0x40,"%s");
  if (local_98[0] == '[') {
    bVar2 = true;
    pcVar7 = local_98 + 1;
    bVar1 = true;
  }
  else {
    for (; (cVar6 = *pcVar7, cVar6 != '\0' && (cVar6 != '.')); pcVar7 = pcVar7 + 1) {
      if (cVar6 == ':') {
        bVar2 = true;
        goto LAB_0011d491;
      }
    }
    bVar2 = false;
LAB_0011d491:
    pcVar7 = local_98;
    bVar1 = false;
  }
  cVar6 = *pcVar7;
  pcVar5 = pcVar7;
  if (cVar6 != '\0') {
    pcVar5 = pcVar7 + 1;
    do {
      if (bVar1) {
        if (cVar6 == ']') {
          pcVar5[-1] = '\0';
          bVar1 = false;
          goto LAB_0011d4d8;
        }
      }
      else if ((bool)(~bVar2 & cVar6 == ':')) break;
      cVar6 = *pcVar5;
      pcVar5 = pcVar5 + 1;
    } while (cVar6 != '\0');
    pcVar5 = pcVar5 + -1;
  }
LAB_0011d4d8:
  iVar4 = 0xf;
  if ((!bVar1) && ((want_port || (*pcVar5 == '\0')))) {
    if (*pcVar5 == ':') {
      *pcVar5 = '\0';
      pcVar5 = pcVar5 + 1;
    }
    __service = "0";
    if (*pcVar5 != '\0') {
      __service = pcVar5;
    }
    hints.ai_flags = 0;
    hints.ai_family = 0;
    hints.ai_addr = (sockaddr *)0x0;
    hints.ai_canonname = (char *)0x0;
    hints.ai_socktype = 0;
    hints.ai_protocol = 0;
    hints.ai_addrlen = 0;
    hints._20_4_ = 0;
    uVar3 = 0;
    if (bVar2) {
      uVar3 = 10;
    }
    buf[0x3c] = (char)uVar3;
    buf[0x3d] = (char)((uint)uVar3 >> 8);
    buf[0x3e] = (char)((uint)uVar3 >> 0x10);
    buf[0x3f] = (char)((uint)uVar3 >> 0x18);
    buf[0x38] = '%';
    buf[0x39] = '\x04';
    buf[0x3a] = '\0';
    buf[0x3b] = '\0';
    iVar4 = getaddrinfo(pcVar7,__service,(addrinfo *)(buf + 0x38),(addrinfo **)&hints.ai_next);
    if (hints.ai_next == (addrinfo *)0x0 || iVar4 != 0) {
      iVar4 = nni_plat_errno(iVar4);
    }
    else {
      nni_posix_sockaddr2nn(sa,(hints.ai_next)->ai_addr,(ulong)(hints.ai_next)->ai_addrlen);
      freeaddrinfo((addrinfo *)hints.ai_next);
      iVar4 = 0;
    }
  }
  return iVar4;
}

Assistant:

int
parse_ip(const char *addr, nng_sockaddr *sa, bool want_port)
{
	struct addrinfo  hints;
	struct addrinfo *results;
	int              rv;
	char            *port;
	char            *host;
	char             buf[64];

#ifdef NNG_ENABLE_IPV6
	bool  v6      = false;
	bool  wrapped = false;
	char *s;
#endif

	if (addr == NULL) {
		addr = "";
	}

	snprintf(buf, sizeof(buf), "%s", addr);
	host = buf;
#ifdef NNG_ENABLE_IPV6
	if (*host == '[') {
		v6      = true;
		wrapped = true;
		host++;
	} else {
		for (s = host; *s != '\0'; s++) {
			if (*s == '.') {
				break;
			}
			if (*s == ':') {
				v6 = true;
				break;
			}
		}
	}
	for (port = host; *port != '\0'; port++) {
		if (wrapped) {
			if (*port == ']') {
				*port++ = '\0';
				wrapped = false;
				break;
			}
		} else if (!v6) {
			if (*port == ':') {
				break;
			}
		}
	}

	if (wrapped) {
		// Never got the closing bracket.
		rv = NNG_EADDRINVAL;
		goto done;
	}
#else  // NNG_ENABLE_IPV6
	for (port = host; *port != '\0'; port++) {
		if (*port == ':') {
			break;
		}
	}
#endif // NNG_ENABLE_IPV6

	if ((!want_port) && (*port != '\0')) {
		rv = NNG_EADDRINVAL;
		goto done;
	} else if (*port == ':') {
		*port++ = '\0';
	}

	if (*port == '\0') {
		port = "0";
	}

	memset(&hints, 0, sizeof(hints));
	hints.ai_flags = AI_NUMERICSERV | AI_NUMERICHOST | AI_PASSIVE;
#ifdef NNG_ENABLE_IPV6
	if (v6) {
		hints.ai_family = AF_INET6;
	}
#else
	hints.ai_family = AF_INET;
#endif
#ifdef AI_ADDRCONFIG
	hints.ai_flags |= AI_ADDRCONFIG;
#endif

	rv = getaddrinfo(host, port, &hints, &results);
	if ((rv != 0) || (results == NULL)) {
		rv = nni_plat_errno(rv);
		goto done;
	}
	nni_posix_sockaddr2nn(
	    sa, (void *) results->ai_addr, results->ai_addrlen);
	freeaddrinfo(results);

done:
	return (rv);
}